

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

bool __thiscall wasm::RemoveUnusedBrs::optimizeLoop(RemoveUnusedBrs *this,Loop *loop)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Id IVar1;
  BranchSeeker *this_01;
  BranchSeeker *pBVar2;
  Index IVar3;
  Expression **ppEVar4;
  Unary *pUVar5;
  Expression *pEVar6;
  Block *pBVar7;
  Break *ifTrue;
  Expression *pEVar8;
  If *pIVar9;
  BranchSeeker *any;
  ulong uVar10;
  Index from;
  bool bVar11;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type;
  Name target;
  anon_class_8_1_911e227b local_1b8;
  anon_class_8_1_911e227b blockifyMerge;
  bool local_1a4;
  bool local_d5;
  size_t local_90;
  size_t local_60;
  Builder local_38;
  Builder builder;
  
  if ((((loop->name).super_IString.str._M_str != (char *)0x0) &&
      (this_01 = (BranchSeeker *)loop->body,
      *(char *)&(this_01->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .replacep == '\x01')) &&
     ((Expression **)0x1 <
      (this_01->
      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      ).
      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      .stack.fixed._M_elems[1].currp)) {
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              ((this_01->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.fixed._M_elems + 1);
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back(this_00);
    pEVar6 = *ppEVar4;
    if (((pEVar6->_id == BreakId) && (pEVar6[2].type.id == 0)) &&
       ((*(long *)(pEVar6 + 2) == 0 &&
        ((char *)pEVar6[1].type.id == (loop->name).super_IString.str._M_str)))) {
      from = *(Index *)&(this_01->
                        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        ).
                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        .stack.fixed._M_elems[1].currp;
      any = (BranchSeeker *)(ulong)(from - 2);
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
           ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           currModule;
      do {
        from = from - 1;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (this_00,(size_t)any);
        pIVar9 = (If *)*ppEVar4;
        IVar1 = (pIVar9->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
        if (IVar1 == BreakId) {
          pEVar8 = *(Expression **)
                    &pIVar9[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression;
          if (pEVar8 == (Expression *)0x0) {
            return false;
          }
          if (pIVar9->ifFalse != (Expression *)0x0) {
            return false;
          }
          if (pIVar9->ifTrue == (Expression *)(loop->name).super_IString.str._M_str) {
            return false;
          }
          target.super_IString.str._M_str =
               (BranchSeeker *)
               ((long)(this_01->
                      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      .stack.fixed._M_elems[1].currp + -2);
          if (target.super_IString.str._M_str == any) {
            pUVar5 = Builder::makeUnary(&local_38,EqZInt32,pEVar8);
            *(Unary **)&pIVar9[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression
                 = pUVar5;
            pEVar8 = pIVar9->ifTrue;
            *(Expression **)(pEVar6 + 1) = pIVar9->condition;
            pEVar6[1].type.id = (uintptr_t)pEVar8;
            pEVar6 = (Expression *)(loop->name).super_IString.str._M_str;
            pIVar9->condition = (Expression *)(loop->name).super_IString.str._M_len;
            pIVar9->ifTrue = pEVar6;
            return true;
          }
          pEVar6 = (Expression *)
                   (this_01->
                   super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   ).
                   super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   .stack.fixed._M_elems[0].currp;
          if (pIVar9->ifTrue != pEVar6) {
            return false;
          }
          target.super_IString.str._M_len = (size_t)pEVar6;
          IVar3 = BranchUtils::BranchSeeker::count
                            (this_01,(Expression *)
                                     (this_01->
                                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     ).
                                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     .stack.fixed._M_elems[0].func,target);
          if (IVar3 != 1) {
            return false;
          }
          pEVar6 = *(Expression **)
                    &pIVar9[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression;
          uVar10 = 0;
          ifTrue = Builder::makeBreak(&local_38,(IString)*(IString *)&pIVar9->condition,
                                      (Expression *)0x0,(Expression *)0x0);
          pEVar8 = stealSlice(&local_38,(Block *)this_01,from,
                              *(Index *)&(this_01->
                                         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                         ).
                                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                         .stack.fixed._M_elems[1].currp);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
          pIVar9 = Builder::makeIf(&local_38,pEVar6,(Expression *)ifTrue,pEVar8,type);
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (this_00,(size_t)any);
          *ppEVar4 = (Expression *)pIVar9;
LAB_00b57ef6:
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)any;
          Block::finalize((Block *)this_01,type__00,Unknown);
          return true;
        }
        if (IVar1 == IfId) {
          pBVar2 = (BranchSeeker *)pIVar9->ifFalse;
          if (pBVar2 == (BranchSeeker *)0x0) {
            if ((pIVar9->ifTrue->type).id != 1) {
              return false;
            }
            any = this_01;
            pEVar6 = stealSlice(&local_38,(Block *)this_01,from,
                                *(Index *)&(this_01->
                                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           ).
                                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           .stack.fixed._M_elems[1].currp);
            pIVar9->ifFalse = pEVar6;
          }
          else {
            if ((pIVar9->condition->type).id == 1) {
              return false;
            }
            if (1 < (pIVar9->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                    type.id) {
              __assert_fail("!iff->type.isConcrete()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                            ,0x279,"bool wasm::RemoveUnusedBrs::optimizeLoop(Loop *)");
            }
            local_1b8.builder = &local_38;
            any = (BranchSeeker *)pIVar9->ifTrue;
            if ((any->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.usedFixed == 1) {
              ppEVar4 = &pIVar9->ifFalse;
              any = pBVar2;
            }
            else {
              if ((pBVar2->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.usedFixed != 1) {
                return false;
              }
              ppEVar4 = &pIVar9->ifTrue;
            }
            pEVar6 = stealSlice(&local_38,(Block *)this_01,from,
                                *(Index *)&(this_01->
                                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           ).
                                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           .stack.fixed._M_elems[1].currp);
            pBVar7 = optimizeLoop::anon_class_8_1_911e227b::operator()
                               (&stack0xfffffffffffffe48,(Expression *)any,pEVar6);
            *ppEVar4 = (Expression *)pBVar7;
          }
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)any;
          If::finalize(pIVar9,type_);
          goto LAB_00b57ef6;
        }
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)&stack0xfffffffffffffe48,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).
                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .currModule,(Expression *)pIVar9);
        if (((local_1a4 != false) || (local_d5 != false)) || (local_60 != 0)) {
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe48);
          return false;
        }
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe48);
        bVar11 = any == (BranchSeeker *)0x0;
        any = (BranchSeeker *)((long)&any[-1].types._M_h._M_single_bucket + 7);
        if (bVar11) {
          return false;
        }
        if (local_90 != 0) {
          return false;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool optimizeLoop(Loop* loop) {
    // if a loop ends in
    // (loop $in
    //   (block $out
    //     if (..) br $in; else br $out;
    //   )
    // )
    // then our normal opts can remove the break out since it flows directly out
    // (and later passes make the if one-armed). however, the simple analysis
    // fails on patterns like
    //     if (..) br $out;
    //     br $in;
    // which is a common way to do a while (1) loop (end it with a jump to the
    // top), so we handle that here. Specifically we want to conditionalize
    // breaks to the loop top, i.e., put them behind a condition, so that other
    // code can flow directly out and thus brs out can be removed. (even if
    // the change is to let a break somewhere else flow out, that can still be
    // helpful, as it shortens the logical loop. it is also good to generate
    // an if-else instead of an if, as it might allow an eqz to be removed
    // by flipping arms)
    if (!loop->name.is()) {
      return false;
    }
    auto* block = loop->body->dynCast<Block>();
    if (!block) {
      return false;
    }
    // does the last element break to the top of the loop?
    auto& list = block->list;
    if (list.size() <= 1) {
      return false;
    }
    auto* last = list.back()->dynCast<Break>();
    if (!last || !ExpressionAnalyzer::isSimple(last) ||
        last->name != loop->name) {
      return false;
    }
    // last is a simple break to the top of the loop. if we can conditionalize
    // it, it won't block things from flowing out and not needing breaks to do
    // so.
    Index i = list.size() - 2;
    Builder builder(*getModule());
    while (1) {
      auto* curr = list[i];
      if (auto* iff = curr->dynCast<If>()) {
        // let's try to move the code going to the top of the loop into the
        // if-else
        if (!iff->ifFalse) {
          // we need the ifTrue to break, so it cannot reach the code we want to
          // move
          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = stealSlice(builder, block, i + 1, list.size());
            iff->finalize();
            block->finalize();
            return true;
          }
        } else if (iff->condition->type != Type::unreachable) {
          // This is already an if-else. If one side is a dead end, we can
          // append to the other, if there is no returned value to concern us.
          // Note that we skip ifs with unreachable conditions, as they are dead
          // code that DCE can remove, and modifying them can lead to errors
          // (one of the arms may still be concrete, in which case appending to
          // it would be invalid).

          // can't be, since in the middle of a block
          assert(!iff->type.isConcrete());

          // ensures the first node is a block, if it isn't already, and merges
          // in the second, either as a single element or, if a block, by
          // appending to the first block. this keeps the order of operations in
          // place, that is, the appended element will be executed after the
          // first node's elements
          auto blockifyMerge = [&](Expression* any,
                                   Expression* append) -> Block* {
            Block* block = nullptr;
            if (any) {
              block = any->dynCast<Block>();
            }
            // if the first isn't a block, or it's a block with a name (so we
            // might branch to the end, and so can't append to it, we might skip
            // that code!) then make a new block
            if (!block || block->name.is()) {
              block = builder.makeBlock(any);
            } else {
              assert(!block->type.isConcrete());
            }
            auto* other = append->dynCast<Block>();
            if (!other) {
              block->list.push_back(append);
            } else {
              for (auto* item : other->list) {
                block->list.push_back(item);
              }
            }
            block->finalize();
            return block;
          };

          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = blockifyMerge(
              iff->ifFalse, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          } else if (iff->ifFalse->type == Type::unreachable) {
            iff->ifTrue = blockifyMerge(
              iff->ifTrue, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          }
        }
        return false;
      } else if (auto* brIf = curr->dynCast<Break>()) {
        // br_if is similar to if.
        if (brIf->condition && !brIf->value && brIf->name != loop->name) {
          if (i == list.size() - 2) {
            // there is the br_if, and then the br to the top, so just flip them
            // and the condition
            brIf->condition = builder.makeUnary(EqZInt32, brIf->condition);
            last->name = brIf->name;
            brIf->name = loop->name;
            return true;
          } else {
            // there are elements in the middle,
            //   br_if $somewhere (condition)
            //   (..more..)
            //   br $in
            // we can convert the br_if to an if. this has a cost, though,
            // so only do it if it looks useful, which it definitely is if
            //  (a) $somewhere is straight out (so the br out vanishes), and
            //  (b) this br_if is the only branch to that block (so the block
            //      will vanish)
            if (brIf->name == block->name &&
                BranchUtils::BranchSeeker::count(block, block->name) == 1) {
              // note that we could drop the last element here, it is a br we
              // know for sure is removable, but telling stealSlice to steal all
              // to the end is more efficient, it can just truncate.
              list[i] =
                builder.makeIf(brIf->condition,
                               builder.makeBreak(brIf->name),
                               stealSlice(builder, block, i + 1, list.size()));
              block->finalize();
              return true;
            }
          }
        }
        return false;
      }
      // if there is control flow, we must stop looking
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr)
            .transfersControlFlow()) {
        return false;
      }
      if (i == 0) {
        return false;
      }
      i--;
    }
  }